

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

curl_ws_frame * curl_ws_meta(CURL *d)

{
  _Bool _Var1;
  void *pvVar2;
  
  if ((((d != (CURL *)0x0) && (*d == -0x3f212453)) &&
      (_Var1 = Curl_is_in_callback((Curl_easy *)d), _Var1)) &&
     (((*(connectdata **)((long)d + 0x20) != (connectdata *)0x0 &&
       ((*(byte *)((long)d + 0xa32) & 0x80) == 0)) &&
      (pvVar2 = Curl_conn_meta_get(*(connectdata **)((long)d + 0x20),"meta:proto:ws:conn"),
      pvVar2 != (void *)0x0)))) {
    return (curl_ws_frame *)((long)pvVar2 + 0xe0);
  }
  return (curl_ws_frame *)0x0;
}

Assistant:

curl_ws_frame *curl_ws_meta(CURL *d)
{
  /* we only return something for websocket, called from within the callback
     when not using raw mode */
  struct Curl_easy *data = d;
  if(GOOD_EASY_HANDLE(data) && Curl_is_in_callback(data) &&
     data->conn && !data->set.ws_raw_mode) {
    struct websocket *ws;
    ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
    if(ws)
      return &ws->frame;

  }
  return NULL;
}